

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O1

void __thiscall
vkt::sr::anon_unknown_0::LinearDerivateCase::initPrograms
          (LinearDerivateCase *this,SourceCollections *programCollection)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  SurfaceType SVar6;
  DerivateFunc DVar7;
  DerivateCaseValues *pDVar8;
  SourceCollections *this_00;
  int i;
  char *pcVar9;
  mapped_type *pmVar10;
  ulong uVar11;
  ProgramSources *pPVar12;
  long lVar13;
  DataType DVar14;
  Precision PVar15;
  char *pcVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  Vec4 dx;
  Vector<float,_4> res_2;
  Vec4 dy;
  Vector<float,_4> res_8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragmentParams;
  string fragmentSrc;
  Vector<float,_4> res_7;
  Vector<float,_4> res_6;
  undefined1 local_138 [8];
  undefined1 auStack_130 [8];
  undefined1 local_128 [32];
  undefined1 local_108 [8];
  undefined8 uStack_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  string local_e8;
  SourceCollections *local_c0;
  float local_b8 [4];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a8;
  string local_78;
  float local_58 [10];
  
  SVar6 = (this->super_TriangleDerivateCase).m_definitions.surfaceType;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._M_impl.super__Rb_tree_header._M_header;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  DVar14 = TYPE_FLOAT_VEC4;
  if (SVar6 == SURFACETYPE_FLOAT_FBO) {
    DVar14 = TYPE_UINT_VEC4;
  }
  local_c0 = programCollection;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
  pcVar9 = glu::getDataTypeName(DVar14);
  local_138 = (undefined1  [8])local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"OUTPUT_TYPE","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_a8,(key_type *)local_138);
  pcVar16 = (char *)pmVar10->_M_string_length;
  strlen(pcVar9);
  std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar16,(ulong)pcVar9);
  if (local_138 != (undefined1  [8])local_128) {
    operator_delete((void *)local_138,local_128._0_8_ + 1);
  }
  PVar15 = PRECISION_HIGHP;
  if (SVar6 != SURFACETYPE_FLOAT_FBO) {
    PVar15 = (this->super_TriangleDerivateCase).m_definitions.precision;
  }
  pcVar9 = glu::getPrecisionName(PVar15);
  local_138 = (undefined1  [8])local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"OUTPUT_PREC","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_a8,(key_type *)local_138);
  pcVar16 = (char *)pmVar10->_M_string_length;
  strlen(pcVar9);
  std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar16,(ulong)pcVar9);
  if (local_138 != (undefined1  [8])local_128) {
    operator_delete((void *)local_138,local_128._0_8_ + 1);
  }
  pcVar9 = glu::getPrecisionName((this->super_TriangleDerivateCase).m_definitions.precision);
  local_138 = (undefined1  [8])local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"PRECISION","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_a8,(key_type *)local_138);
  pcVar16 = (char *)pmVar10->_M_string_length;
  strlen(pcVar9);
  std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar16,(ulong)pcVar9);
  if (local_138 != (undefined1  [8])local_128) {
    operator_delete((void *)local_138,local_128._0_8_ + 1);
  }
  pcVar9 = glu::getDataTypeName((this->super_TriangleDerivateCase).m_definitions.dataType);
  local_138 = (undefined1  [8])local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"DATATYPE","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_a8,(key_type *)local_138);
  pcVar16 = (char *)pmVar10->_M_string_length;
  strlen(pcVar9);
  std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar16,(ulong)pcVar9);
  if (local_138 != (undefined1  [8])local_128) {
    operator_delete((void *)local_138,local_128._0_8_ + 1);
  }
  uVar11 = (ulong)(this->super_TriangleDerivateCase).m_definitions.func;
  if (uVar11 < 9) {
    pcVar16 = (&PTR_anon_var_dwarf_b18a98_00d25620)[uVar11];
  }
  else {
    pcVar16 = (char *)0x0;
  }
  local_138 = (undefined1  [8])local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"FUNC","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_a8,(key_type *)local_138);
  pcVar9 = (char *)pmVar10->_M_string_length;
  strlen(pcVar16);
  std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar9,(ulong)pcVar16);
  if (local_138 != (undefined1  [8])local_128) {
    operator_delete((void *)local_138,local_128._0_8_ + 1);
  }
  this_00 = local_c0;
  DVar14 = (this->super_TriangleDerivateCase).m_definitions.dataType;
  if (SVar6 == SURFACETYPE_FLOAT_FBO) {
    if (DVar14 == TYPE_FLOAT_VEC3) {
      pcVar16 = "floatBitsToUint(vec4(res, 1.0))";
    }
    else if (DVar14 == TYPE_FLOAT_VEC4) {
      pcVar16 = "floatBitsToUint(res)";
    }
    else {
      pcVar16 = "floatBitsToUint(vec4(res, 0.0, 0.0, 1.0))";
      if (DVar14 == TYPE_FLOAT_VEC2) {
        pcVar16 = "floatBitsToUint(vec4(res, 0.0, 1.0))";
      }
    }
    local_138 = (undefined1  [8])local_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"CAST_TO_OUTPUT","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_a8,(key_type *)local_138);
    pcVar9 = (char *)pmVar10->_M_string_length;
    strlen(pcVar16);
    std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar9,(ulong)pcVar16);
    PVar15 = (Precision)pcVar16;
  }
  else {
    if (DVar14 == TYPE_FLOAT_VEC3) {
      pcVar16 = "vec4(res, 1.0)";
    }
    else if (DVar14 == TYPE_FLOAT_VEC4) {
      pcVar16 = "res";
    }
    else {
      pcVar16 = "vec4(res, 0.0, 0.0, 1.0)";
      if (DVar14 == TYPE_FLOAT_VEC2) {
        pcVar16 = "vec4(res, 0.0, 1.0)";
      }
    }
    local_138 = (undefined1  [8])local_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"CAST_TO_OUTPUT","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_a8,(key_type *)local_138);
    pcVar9 = (char *)pmVar10->_M_string_length;
    strlen(pcVar16);
    std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar9,(ulong)pcVar16);
    PVar15 = (Precision)pcVar16;
  }
  if (local_138 != (undefined1  [8])local_128) {
    operator_delete((void *)local_138,local_128._0_8_ + 1);
  }
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_138,&this->m_fragmentTmpl);
  tcu::StringTemplate::specialize
            (&local_78,(StringTemplate *)local_138,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_a8);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_138);
  paVar1 = &local_e8.field_2;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"vert","");
  pPVar12 = ::vk::ProgramCollection<glu::ProgramSources>::add(&this_00->glslSources,&local_e8);
  sr::(anonymous_namespace)::genVertexSource_abi_cxx11_
            ((string *)local_108,
             (_anonymous_namespace_ *)
             (ulong)(this->super_TriangleDerivateCase).m_definitions.coordDataType,
             (this->super_TriangleDerivateCase).m_definitions.coordPrecision,PVar15);
  local_138 = (undefined1  [8])((ulong)local_138 & 0xffffffff00000000);
  pcVar2 = local_128 + 8;
  auStack_130 = (undefined1  [8])pcVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_130,local_108,(char *)((long)local_108 + uStack_100));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar12->sources + ((ulong)local_138 & 0xffffffff),(value_type *)auStack_130);
  if (auStack_130 != (undefined1  [8])pcVar2) {
    operator_delete((void *)auStack_130,local_128._8_8_ + 1);
  }
  if (local_108 != (undefined1  [8])&local_f8) {
    operator_delete((void *)local_108,local_f8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"frag","");
  pPVar12 = ::vk::ProgramCollection<glu::ProgramSources>::add(&this_00->glslSources,&local_e8);
  local_138._0_4_ = 1;
  auStack_130 = (undefined1  [8])pcVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_130,local_78._M_dataplus._M_p,
             local_78._M_dataplus._M_p + local_78._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar12->sources + ((ulong)local_138 & 0xffffffff),(value_type *)auStack_130);
  if (auStack_130 != (undefined1  [8])pcVar2) {
    operator_delete((void *)auStack_130,local_128._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  uVar11 = (ulong)(this->super_TriangleDerivateCase).m_definitions.precision;
  if (uVar11 < 3) {
    fVar17 = *(float *)(&DAT_00b179f4 + uVar11 * 4);
    fVar18 = *(float *)(&DAT_00b17a00 + uVar11 * 4);
    fVar19 = *(float *)(&DAT_00b17a0c + uVar11 * 4);
    fVar20 = *(float *)(&DAT_00b17a18 + uVar11 * 4);
    fVar3 = *(float *)(&DAT_00b17a24 + uVar11 * 4);
    fVar4 = *(float *)(&DAT_00b17a30 + uVar11 * 4);
    fVar5 = *(float *)(&DAT_00b17a3c + uVar11 * 4);
    (this->super_TriangleDerivateCase).m_values.coordMin.m_data[0] =
         *(float *)(&DAT_00b179e8 + uVar11 * 4);
    (this->super_TriangleDerivateCase).m_values.coordMin.m_data[1] = fVar17;
    (this->super_TriangleDerivateCase).m_values.coordMin.m_data[2] = fVar18;
    (this->super_TriangleDerivateCase).m_values.coordMin.m_data[3] = fVar19;
    (this->super_TriangleDerivateCase).m_values.coordMax.m_data[0] = fVar20;
    (this->super_TriangleDerivateCase).m_values.coordMax.m_data[1] = fVar3;
    (this->super_TriangleDerivateCase).m_values.coordMax.m_data[2] = fVar4;
    (this->super_TriangleDerivateCase).m_values.coordMax.m_data[3] = fVar5;
  }
  if ((this->super_TriangleDerivateCase).m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO) {
    lVar13 = 0;
    do {
      *(undefined4 *)(local_138 + lVar13 * 4) = 0x3f800000;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    fVar17 = (float)local_138._0_4_;
    fVar18 = (float)local_138._4_4_;
    fVar19 = (float)auStack_130._0_4_;
    fVar20 = (float)auStack_130._4_4_;
  }
  else {
    local_e8._M_dataplus._M_p = (pointer)0x0;
    local_e8._M_string_length = 0;
    lVar13 = 0;
    do {
      *(float *)((long)&local_e8._M_dataplus._M_p + lVar13 * 4) =
           (this->super_TriangleDerivateCase).m_values.coordMax.m_data[lVar13] -
           (this->super_TriangleDerivateCase).m_values.coordMin.m_data[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    local_108 = (undefined1  [8])0x42c6000042c60000;
    uStack_100 = 0xc246000042460000;
    local_138 = (undefined1  [8])0x0;
    auStack_130 = (undefined1  [8])0x0;
    lVar13 = 0;
    do {
      *(float *)(local_138 + lVar13 * 4) =
           *(float *)((long)&local_e8._M_dataplus._M_p + lVar13 * 4) /
           *(float *)(local_108 + lVar13 * 4);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    local_108 = (undefined1  [8])0x0;
    uStack_100 = 0;
    lVar13 = 0;
    do {
      *(float *)(local_108 + lVar13 * 4) =
           (this->super_TriangleDerivateCase).m_values.coordMax.m_data[lVar13] -
           (this->super_TriangleDerivateCase).m_values.coordMin.m_data[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    local_b8[0] = 133.0;
    local_b8[1] = 133.0;
    local_b8[2] = 66.5;
    local_b8[3] = -66.5;
    local_e8._M_dataplus._M_p = (pointer)0x0;
    local_e8._M_string_length = 0;
    lVar13 = 0;
    do {
      *(float *)((long)&local_e8._M_dataplus._M_p + lVar13 * 4) =
           *(float *)(local_108 + lVar13 * 4) / local_b8[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    DVar7 = (this->super_TriangleDerivateCase).m_definitions.func;
    if (DVar7 < DERIVATE_DFDY) {
      local_108 = (undefined1  [8])0x0;
      uStack_100 = 0;
      lVar13 = 0;
      do {
        *(float *)(local_108 + lVar13 * 4) = 0.5 / *(float *)(local_138 + lVar13 * 4);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
    }
    else if (DVar7 - DERIVATE_DFDY < 3) {
      local_108 = (undefined1  [8])0x0;
      uStack_100 = 0;
      lVar13 = 0;
      do {
        *(float *)(local_108 + lVar13 * 4) =
             0.5 / *(float *)((long)&local_e8._M_dataplus._M_p + lVar13 * 4);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
    }
    else {
      if (2 < DVar7 - DERIVATE_FWIDTH) goto LAB_00580331;
      local_58[4] = 0.0;
      local_58[5] = 0.0;
      local_58[6] = 0.0;
      local_58[7] = 0.0;
      lVar13 = 0;
      do {
        fVar17 = *(float *)(local_138 + lVar13 * 4);
        fVar18 = -fVar17;
        if (-fVar17 <= fVar17) {
          fVar18 = fVar17;
        }
        local_58[lVar13 + 4] = fVar18;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
      local_58[0] = 0.0;
      local_58[1] = 0.0;
      local_58[2] = 0.0;
      local_58[3] = 0.0;
      lVar13 = 0;
      do {
        fVar17 = *(float *)((long)&local_e8._M_dataplus._M_p + lVar13 * 4);
        fVar18 = -fVar17;
        if (-fVar17 <= fVar17) {
          fVar18 = fVar17;
        }
        local_58[lVar13] = fVar18;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
      local_b8[0] = 0.0;
      local_b8[1] = 0.0;
      local_b8[2] = 0.0;
      local_b8[3] = 0.0;
      lVar13 = 0;
      do {
        local_b8[lVar13] = local_58[lVar13 + 4] + local_58[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
      local_108 = (undefined1  [8])0x0;
      uStack_100 = 0;
      lVar13 = 0;
      do {
        *(float *)(local_108 + lVar13 * 4) = 0.5 / local_b8[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
    }
    fVar17 = (float)local_108._0_4_;
    fVar18 = (float)local_108._4_4_;
    fVar19 = (float)uStack_100;
    fVar20 = uStack_100._4_4_;
  }
  (this->super_TriangleDerivateCase).m_values.derivScale.m_data[0] = fVar17;
  (this->super_TriangleDerivateCase).m_values.derivScale.m_data[1] = fVar18;
  (this->super_TriangleDerivateCase).m_values.derivScale.m_data[2] = fVar19;
  (this->super_TriangleDerivateCase).m_values.derivScale.m_data[3] = fVar20;
LAB_00580331:
  (this->super_TriangleDerivateCase).m_values.derivBias.m_data[0] = 0.0;
  (this->super_TriangleDerivateCase).m_values.derivBias.m_data[1] = 0.0;
  pDVar8 = &(this->super_TriangleDerivateCase).m_values;
  (pDVar8->derivBias).m_data[2] = 0.0;
  (pDVar8->derivBias).m_data[3] = 0.0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a8);
  return;
}

Assistant:

void LinearDerivateCase::initPrograms (vk::SourceCollections& programCollection) const
{
	const tcu::UVec2	viewportSize	(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
	const float			w				= float(viewportSize.x());
	const float			h				= float(viewportSize.y());
	const bool			packToInt		= m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO;
	map<string, string>	fragmentParams;

	fragmentParams["OUTPUT_TYPE"]		= glu::getDataTypeName(packToInt ? glu::TYPE_UINT_VEC4 : glu::TYPE_FLOAT_VEC4);
	fragmentParams["OUTPUT_PREC"]		= glu::getPrecisionName(packToInt ? glu::PRECISION_HIGHP : m_definitions.precision);
	fragmentParams["PRECISION"]			= glu::getPrecisionName(m_definitions.precision);
	fragmentParams["DATATYPE"]			= glu::getDataTypeName(m_definitions.dataType);
	fragmentParams["FUNC"]				= getDerivateFuncName(m_definitions.func);

	if (packToInt)
	{
		fragmentParams["CAST_TO_OUTPUT"]	= m_definitions.dataType == glu::TYPE_FLOAT_VEC4 ? "floatBitsToUint(res)" :
											  m_definitions.dataType == glu::TYPE_FLOAT_VEC3 ? "floatBitsToUint(vec4(res, 1.0))" :
											  m_definitions.dataType == glu::TYPE_FLOAT_VEC2 ? "floatBitsToUint(vec4(res, 0.0, 1.0))" :
											  /* TYPE_FLOAT */								   "floatBitsToUint(vec4(res, 0.0, 0.0, 1.0))";
	}
	else
	{
		fragmentParams["CAST_TO_OUTPUT"]	= m_definitions.dataType == glu::TYPE_FLOAT_VEC4 ? "res" :
											  m_definitions.dataType == glu::TYPE_FLOAT_VEC3 ? "vec4(res, 1.0)" :
											  m_definitions.dataType == glu::TYPE_FLOAT_VEC2 ? "vec4(res, 0.0, 1.0)" :
											  /* TYPE_FLOAT */								   "vec4(res, 0.0, 0.0, 1.0)";
	}

	std::string fragmentSrc = tcu::StringTemplate(m_fragmentTmpl).specialize(fragmentParams);
	programCollection.glslSources.add("vert") << glu::VertexSource(genVertexSource(m_definitions.coordDataType, m_definitions.coordPrecision));
	programCollection.glslSources.add("frag") << glu::FragmentSource(fragmentSrc);

	switch (m_definitions.precision)
	{
		case glu::PRECISION_HIGHP:
			m_values.coordMin = tcu::Vec4(-97.f, 0.2f, 71.f, 74.f);
			m_values.coordMax = tcu::Vec4(-13.2f, -77.f, 44.f, 76.f);
			break;

		case glu::PRECISION_MEDIUMP:
			m_values.coordMin = tcu::Vec4(-37.0f, 47.f, -7.f, 0.0f);
			m_values.coordMax = tcu::Vec4(-1.0f, 12.f, 7.f, 19.f);
			break;

		case glu::PRECISION_LOWP:
			m_values.coordMin = tcu::Vec4(0.0f, -1.0f, 0.0f, 1.0f);
			m_values.coordMax = tcu::Vec4(1.0f, 1.0f, -1.0f, -1.0f);
			break;

		default:
			DE_ASSERT(false);
	}

	if (m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO)
	{
		// No scale or bias used for accuracy.
		m_values.derivScale	= tcu::Vec4(1.0f);
		m_values.derivBias		= tcu::Vec4(0.0f);
	}
	else
	{
		// Compute scale - bias that normalizes to 0..1 range.
		const tcu::Vec4 dx = (m_values.coordMax - m_values.coordMin) / tcu::Vec4(w, w, w*0.5f, -w*0.5f);
		const tcu::Vec4 dy = (m_values.coordMax - m_values.coordMin) / tcu::Vec4(h, h, h*0.5f, -h*0.5f);

		if (isDfdxFunc(m_definitions.func))
			m_values.derivScale = 0.5f / dx;
		else if (isDfdyFunc(m_definitions.func))
			m_values.derivScale = 0.5f / dy;
		else if (isFwidthFunc(m_definitions.func))
			m_values.derivScale = 0.5f / (tcu::abs(dx) + tcu::abs(dy));
		else
			DE_ASSERT(false);

		m_values.derivBias = tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);
	}
}